

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

Value * __thiscall
minja::SubscriptExpr::do_evaluate
          (Value *__return_storage_ptr__,SubscriptExpr *this,shared_ptr<minja::Context> *context)

{
  _Atomic_word *p_Var1;
  Expression *pEVar2;
  element_type *peVar3;
  element_type *peVar4;
  int iVar5;
  long lVar6;
  size_t index;
  size_t sVar7;
  size_t sVar8;
  Value *v;
  long *plVar9;
  runtime_error *prVar10;
  element_type *peVar11;
  size_type *psVar12;
  char *pcVar13;
  long i;
  string s;
  Value target_value;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  data local_158;
  Value local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Value local_d8;
  string local_88;
  vector<minja::Value,_std::allocator<minja::Value>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pEVar2 = (this->base).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pEVar2 == (Expression *)0x0) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"SubscriptExpr.base is null");
  }
  else {
    if ((this->index).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      Expression::evaluate(&local_148,pEVar2,context);
      pEVar2 = (this->index).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((pEVar2 == (Expression *)0x0) ||
         (lVar6 = __dynamic_cast(pEVar2,&Expression::typeinfo,&SliceExpr::typeinfo), lVar6 == 0)) {
        Expression::evaluate((Value *)local_198,pEVar2,context);
        if ((local_148.object_.
             super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr == (element_type *)0x0) &&
           (((local_148.array_.
              super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr == (element_type *)0x0 && (local_148.primitive_.m_data.m_type == null)) &&
            (local_148.callable_.
             super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr == (element_type *)0x0)))) {
          peVar3 = (this->base).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if ((peVar3 != (element_type *)0x0) &&
             (lVar6 = __dynamic_cast(peVar3,&Expression::typeinfo,&VariableExpr::typeinfo),
             lVar6 != 0)) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f8,*(long *)(lVar6 + 0x20),
                       *(long *)(lVar6 + 0x28) + *(long *)(lVar6 + 0x20));
            std::operator+(&local_50,"\'",&local_f8);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_1d8._M_dataplus._M_p = (pointer)*plVar9;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((size_type *)local_1d8._M_dataplus._M_p == psVar12) {
              local_1d8.field_2._M_allocated_capacity = *psVar12;
              local_1d8.field_2._8_4_ = (undefined4)plVar9[3];
              local_1d8.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            }
            else {
              local_1d8.field_2._M_allocated_capacity = *psVar12;
            }
            local_1d8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            peVar4 = (context->super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,*(long *)(lVar6 + 0x20),
                       *(long *)(lVar6 + 0x28) + *(long *)(lVar6 + 0x20));
            Value::Value(&local_d8,&local_88);
            (*peVar4->_vptr_Context[4])(peVar4,&local_d8);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d8);
            local_1b8._M_dataplus._M_p = (pointer)*plVar9;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((size_type *)local_1b8._M_dataplus._M_p == psVar12) {
              local_1b8.field_2._M_allocated_capacity = *psVar12;
              local_1b8.field_2._8_8_ = plVar9[3];
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            }
            else {
              local_1b8.field_2._M_allocated_capacity = *psVar12;
            }
            local_1b8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::runtime_error::runtime_error(prVar10,(string *)&local_1b8);
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          Value::dump_abi_cxx11_(&local_1d8,(Value *)local_198,-1,false);
          std::operator+(&local_1b8,"Trying to access property \'",&local_1d8);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
          super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar9;
          peVar11 = (element_type *)(plVar9 + 2);
          if (local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
              super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr == peVar11) {
            local_d8.array_.
            super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)
                      (peVar11->super_enable_shared_from_this<minja::Value>)._M_weak_this.
                      super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_d8.array_.
            super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[3];
            local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
            super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&local_d8.array_;
          }
          else {
            local_d8.array_.
            super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)
                      (peVar11->super_enable_shared_from_this<minja::Value>)._M_weak_this.
                      super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
          super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[1];
          *plVar9 = (long)peVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::runtime_error::runtime_error(prVar10,(string *)&local_d8);
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        Value::get(__return_storage_ptr__,&local_148,(Value *)local_198);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_158,false);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_158);
        if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
        }
        if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)(local_198._8_8_ + 0xc);
            iVar5 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar5 = *(_Atomic_word *)(local_198._8_8_ + 0xc);
            *(int *)(local_198._8_8_ + 0xc) = iVar5 + -1;
          }
          if (iVar5 == 1) {
            (*(*(_func_int ***)local_198._8_8_)[3])();
          }
        }
      }
      else {
        if (*(Expression **)(lVar6 + 0x20) == (Expression *)0x0) {
          index = 0;
        }
        else {
          Expression::evaluate((Value *)local_198,*(Expression **)(lVar6 + 0x20),context);
          index = Value::get<long>((Value *)local_198);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_158,false);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_158);
          if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
          }
          if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = (_Atomic_word *)(local_198._8_8_ + 0xc);
              iVar5 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar5 = *(_Atomic_word *)(local_198._8_8_ + 0xc);
              *(int *)(local_198._8_8_ + 0xc) = iVar5 + -1;
            }
            if (iVar5 == 1) {
              (*(*(_func_int ***)local_198._8_8_)[3])();
            }
          }
        }
        if (*(Expression **)(lVar6 + 0x30) == (Expression *)0x0) {
          sVar7 = Value::size(&local_148);
        }
        else {
          Expression::evaluate((Value *)local_198,*(Expression **)(lVar6 + 0x30),context);
          sVar7 = Value::get<long>((Value *)local_198);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_158,false);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_158);
          if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
          }
          if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = (_Atomic_word *)(local_198._8_8_ + 0xc);
              iVar5 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar5 = *(_Atomic_word *)(local_198._8_8_ + 0xc);
              *(int *)(local_198._8_8_ + 0xc) = iVar5 + -1;
            }
            if (iVar5 == 1) {
              (*(*(_func_int ***)local_198._8_8_)[3])();
            }
          }
        }
        if (local_148.primitive_.m_data.m_type == string) {
          Value::get<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     &local_148);
          std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_198);
          Value::Value(__return_storage_ptr__,(string *)&local_d8);
          if (local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
              super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)&local_d8.array_) {
            operator_delete(local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
                            super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)((long)&((local_d8.array_.
                                             super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->
                                           super__Vector_base<minja::Value,_std::allocator<minja::Value>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
          }
          if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
          }
        }
        else {
          if (local_148.array_.
              super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr == (element_type *)0x0) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            pcVar13 = "Cannot subscript null";
            if (local_148.callable_.
                super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != (element_type *)0x0) {
              pcVar13 = "Subscripting only supported on arrays and strings";
            }
            if (local_148.primitive_.m_data.m_type != null) {
              pcVar13 = "Subscripting only supported on arrays and strings";
            }
            if (local_148.array_.
                super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != (element_type *)0x0 ||
                local_148.object_.
                super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != (element_type *)0x0) {
              pcVar13 = "Subscripting only supported on arrays and strings";
            }
            std::runtime_error::runtime_error(prVar10,pcVar13);
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if ((long)index < 0) {
            sVar8 = Value::size(&local_148);
            index = index + sVar8;
          }
          if ((long)sVar7 < 0) {
            sVar8 = Value::size(&local_148);
            sVar7 = sVar7 + sVar8;
          }
          local_68.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Value::array(__return_storage_ptr__,&local_68);
          std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_68);
          if ((long)index < (long)sVar7) {
            do {
              v = Value::at(&local_148,index);
              Value::push_back(__return_storage_ptr__,v);
              index = index + 1;
            } while (sVar7 != index);
          }
        }
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant(&local_148.primitive_,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_148.primitive_.m_data);
      if (local_148.callable_.
          super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.callable_.
                   super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_148.object_.
          super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.object_.
                   super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_148.array_.
          super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.array_.
                   super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_148.super_enable_shared_from_this<minja::Value>._M_weak_this.
          super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_148.super_enable_shared_from_this<minja::Value>._M_weak_this.
                     super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = (local_148.super_enable_shared_from_this<minja::Value>._M_weak_this.
                   super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
          (local_148.super_enable_shared_from_this<minja::Value>._M_weak_this.
           super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*(local_148.super_enable_shared_from_this<minja::Value>._M_weak_this.
             super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[3])();
        }
      }
      return __return_storage_ptr__;
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"SubscriptExpr.index is null");
  }
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!base) throw std::runtime_error("SubscriptExpr.base is null");
        if (!index) throw std::runtime_error("SubscriptExpr.index is null");
        auto target_value = base->evaluate(context);
        if (auto slice = dynamic_cast<SliceExpr*>(index.get())) {
          auto start = slice->start ? slice->start->evaluate(context).get<int64_t>() : 0;
          auto end = slice->end ? slice->end->evaluate(context).get<int64_t>() : (int64_t) target_value.size();
          if (target_value.is_string()) {
            std::string s = target_value.get<std::string>();
            if (start < 0) start = s.size() + start;
            if (end < 0) end = s.size() + end;
            return s.substr(start, end - start);
          } else if (target_value.is_array()) {
            if (start < 0) start = target_value.size() + start;
            if (end < 0) end = target_value.size() + end;
            auto result = Value::array();
            for (auto i = start; i < end; ++i) {
              result.push_back(target_value.at(i));
            }
            return result;
          } else {
            throw std::runtime_error(target_value.is_null() ? "Cannot subscript null" : "Subscripting only supported on arrays and strings");
          }
        } else {
          auto index_value = index->evaluate(context);
          if (target_value.is_null()) {
            if (auto t = dynamic_cast<VariableExpr*>(base.get())) {
              throw std::runtime_error("'" + t->get_name() + "' is " + (context->contains(t->get_name()) ? "null" : "not defined"));
            }
            throw std::runtime_error("Trying to access property '" +  index_value.dump() + "' on null!");
          }
          return target_value.get(index_value);
        }
    }